

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.h
# Opt level: O0

bool slang::ast::VariableSymbol::isKind(SymbolKind kind)

{
  SymbolKind kind_local;
  bool local_1;
  
  if (((kind - Variable < 4) || (kind - Iterator < 2)) ||
     (kind == ClockVar || kind == LocalAssertionVar)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool isKind(SymbolKind kind) {
        switch (kind) {
            case SymbolKind::Variable:
            case SymbolKind::FormalArgument:
            case SymbolKind::Field:
            case SymbolKind::ClassProperty:
            case SymbolKind::Iterator:
            case SymbolKind::PatternVar:
            case SymbolKind::ClockVar:
            case SymbolKind::LocalAssertionVar:
                return true;
            default:
                return false;
        }
    }